

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  initializer_list<int> __l;
  NeuralNetwork nn;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  test_y;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  test_x;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  train_y;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  train_x;
  Parser parser;
  vector<int,_std::allocator<int>_> *this;
  allocator_type *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  undefined1 *puVar5;
  allocator<char> local_121;
  string local_120 [63];
  undefined1 local_e1 [57];
  derive_activate_func_t in_stack_ffffffffffffff58;
  activate_func_t in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  NeuralNetwork *in_stack_ffffffffffffff80;
  allocator<char> local_51;
  string local_50 [16];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_ffffffffffffffc0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_ffffffffffffffc8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_ffffffffffffffd0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_ffffffffffffffd8;
  NeuralNetwork *in_stack_ffffffffffffffe0;
  
  std::ios_base::sync_with_stdio(false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  Parser::parse_features
            ((Parser *)
             nn.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start,(string *)nn._32_8_);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  Parser::parse_labels
            ((Parser *)
             nn.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (string *)
             nn.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  this = (vector<int,_std::allocator<int>_> *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  Parser::parse_features
            ((Parser *)
             nn.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start,(string *)nn._32_8_);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  Parser::parse_labels
            ((Parser *)
             nn.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (string *)
             nn.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  uVar1 = 0x310;
  uVar2 = 100;
  uVar3 = 0x32;
  uVar4 = 10;
  puVar5 = &stack0xfffffffffffffe60;
  std::allocator<int>::allocator((allocator<int> *)0x141872);
  __l._M_array._4_4_ = uVar4;
  __l._M_array._0_4_ = uVar3;
  __l._M_len = (size_type)puVar5;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar2,uVar1),__l,
             in_stack_fffffffffffffe58);
  NeuralNetwork::NeuralNetwork
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  std::allocator<int>::~allocator((allocator<int> *)0x1418d2);
  NeuralNetwork::train
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  NeuralNetwork::~NeuralNetwork((NeuralNetwork *)0x141913);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)this);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)this);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)this);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)this);
  return 0;
}

Assistant:

int main(int, char**) {
    std::ios::sync_with_stdio(false);
    Parser parser;
    using namespace std;
    // MNIST数据集
    auto train_x = parser.parse_features("../data/train-images-idx3-ubyte");
    auto train_y = parser.parse_labels("../data/train-labels-idx1-ubyte");
    auto test_x = parser.parse_features("../data/t10k-images-idx3-ubyte");
    auto test_y = parser.parse_labels("../data/t10k-labels-idx1-ubyte");
    //参数{28 * 28, 50, 10}表示构建一个三层的神经网络，其中
    //输入层是28*28=784个节点，隐层是50个节点，输出层是10个节点，隐层数量可以增加，第一个和最后一个总是表示输入层和输出层的节点数量
    NeuralNetwork nn({28 * 28, 100,50, 10}, 0.005, 30, 50, &relu, &derive_relu);
    // NeuralNetwork nn({28 * 28, 150, 10}, 0.005, 30, 20);
    nn.train(train_x, train_y, test_x, test_y);

    return 0;
}